

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O0

void HelpMarker(char *desc)

{
  bool bVar1;
  char *in_RDI;
  
  ImGui::TextDisabled("(?)");
  bVar1 = ImGui::IsItemHovered((ImGuiHoveredFlags)desc);
  if (bVar1) {
    ImGui::BeginTooltip();
    ImGui::GetFontSize();
    ImGui::PushTextWrapPos(desc._4_4_);
    ImGui::TextUnformatted(desc,in_RDI);
    ImGui::PopTextWrapPos();
    ImGui::EndTooltip();
  }
  return;
}

Assistant:

static void HelpMarker(const char* desc)
{
    ImGui::TextDisabled("(?)");
    if (ImGui::IsItemHovered())
    {
        ImGui::BeginTooltip();
        ImGui::PushTextWrapPos(ImGui::GetFontSize() * 35.0f);
        ImGui::TextUnformatted(desc);
        ImGui::PopTextWrapPos();
        ImGui::EndTooltip();
    }
}